

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                 *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2,int dist)

{
  comm *comm;
  unsigned_long *puVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  pointer pmVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  pointer pTVar13;
  size_t sVar14;
  bool bVar15;
  unsigned_long uVar16;
  ostream *poVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pmVar20;
  pointer puVar21;
  unsigned_long uVar22;
  int iVar23;
  ulong uVar24;
  pointer puVar25;
  size_t sVar26;
  _func_int **pp_Var27;
  long lVar28;
  pointer pTVar29;
  _func_void *p_Var30;
  ulong uVar31;
  MPI_Datatype poVar32;
  size_t prefix;
  int overlap_type;
  MPI_Datatype local_238;
  uint local_22c;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> msgs;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> bucket;
  int my_schedule;
  custom_op<unsigned_long,_true> op;
  int left_p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> active_elements;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> left_bucket;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> out_of_bounds_msgs;
  size_t local_130;
  size_t unresolved_els;
  unsigned_long result;
  int result_2;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> right_bucket;
  size_t rebucket_offset;
  size_t bucket_offset;
  size_t unfinished_b;
  unsigned_long local_b8;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> border_bucket;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  minqueries;
  section_timer timer;
  
  comm = &this->comm;
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&timer,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
  uVar16 = mxx::left_shift<unsigned_long>
                     ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start,comm);
  prefix = (this->part).prefix;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  op._vptr_custom_op = (_func_int **)0x0;
  puVar21 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar21) {
    do {
      uVar22 = (long)op._vptr_custom_op + prefix + 1;
      if (((puVar21[(long)op._vptr_custom_op] != uVar22) ||
          ((pp_Var27 = (_func_int **)(this->local_size - 1), op._vptr_custom_op < pp_Var27 &&
           (puVar21[(long)op._vptr_custom_op + 1] == uVar22)))) ||
         ((op._vptr_custom_op == pp_Var27 &&
          ((uVar16 == uVar22 && ((this->comm).m_rank < this->p + -1)))))) {
        if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&active_elements,
                     (iterator)
                     active_elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&op);
        }
        else {
          *active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish = (unsigned_long)op._vptr_custom_op;
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      op._vptr_custom_op = (_func_int **)((long)op._vptr_custom_op + 1);
      puVar21 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while (op._vptr_custom_op <
             (_func_int **)
             ((long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar21 >> 3));
  }
  op._vptr_custom_op = (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&op,"get active elements","");
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&op);
  if (op._vptr_custom_op !=
      (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8)) {
    operator_delete(op._vptr_custom_op);
  }
  if ((this->comm).m_rank < this->p + -1) {
    puVar21 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_22c = (uint)CONCAT71((int7)((ulong)puVar21 >> 8),puVar21[-1] == uVar16);
  }
  else {
    local_22c = 0;
  }
  uVar24 = (ulong)dist;
  local_238 = (MPI_Datatype)param_1;
  if (uVar24 < this->n) {
    do {
      puVar21 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      out_of_bounds_msgs.
      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unresolved_els = 0;
      unfinished_b = 0;
      for (puVar25 = active_elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar25 != puVar21; puVar25 = puVar25 + 1) {
        uVar22 = *puVar25;
        p_Var30 = (_func_void *)(prefix + uVar22);
        puVar2 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        op.m_user_func.super__Function_base._M_functor._M_unused._M_function_pointer = p_Var30;
        if (puVar2[uVar22] + uVar24 < this->n) {
          op._vptr_custom_op = (_func_int **)(puVar2[uVar22] + uVar24);
          if (msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
            _M_realloc_insert<mypair<unsigned_long>>
                      ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                       (iterator)
                       msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_long> *)&op);
          }
          else {
            (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = (unsigned_long)op._vptr_custom_op;
            (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = (unsigned_long)p_Var30;
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          op._vptr_custom_op = (_func_int **)0x0;
          if (out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              out_of_bounds_msgs.
              super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
            _M_realloc_insert<mypair<unsigned_long>>
                      ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)
                       &out_of_bounds_msgs,
                       (iterator)
                       out_of_bounds_msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(mypair<unsigned_long> *)&op);
          }
          else {
            *(undefined4 *)
             &(out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = 0;
            *(undefined4 *)
             ((long)&(out_of_bounds_msgs.
                      super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->first + 4) = 0;
            (out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->second = (unsigned_long)p_Var30;
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 out_of_bounds_msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        unresolved_els = unresolved_els + 1;
        if (*(code **)(*(long *)local_238 + uVar22 * 8) == p_Var30 + 1) {
          unfinished_b = unfinished_b + 1;
        }
      }
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unresolved_els,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      poVar32 = local_238;
      lVar5 = CONCAT44(result._4_4_,(uint)result);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
                ((custom_op<unsigned_long,true> *)&op);
      MPI_Allreduce(&unfinished_b,&result,1,op.m_type_copy,op.m_op,(this->comm).mpi_comm);
      mxx::custom_op<unsigned_long,_true>::~custom_op(&op);
      if ((this->comm).m_rank == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," unresolved = ",0xe);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"==== chaising iteration ",0x18);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," unfinished = ",0xe);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
      }
      if (lVar5 != 0) {
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_1_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar21 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar20 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar20->first = puVar21[pmVar20->first - prefix];
            pmVar20 = pmVar20 + 1;
          } while (pmVar20 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_2_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>>
                    ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                     msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        pmVar6 = msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pmVar20 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            out_of_bounds_msgs.
            super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               out_of_bounds_msgs.
               super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar18 = (long)msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)msgs.
                       super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        if (uVar18 != unresolved_els) {
          __assert_fail("msgs.size() == unresolved_els",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5be,
                        "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                       );
        }
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar4 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                    (msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                    (pmVar20,pmVar6);
        }
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        left_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        left_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        left_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        right_bucket.
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        minqueries.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        overlap_type = 0;
        lVar4 = **(long **)poVar32;
        local_130 = 0;
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_130 = 0;
          pmVar20 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_b8 = uVar16;
          do {
            uVar31 = *(ulong *)(*(long *)poVar32 + (pmVar20->second - prefix) * 8);
            uVar18 = uVar31 - 1;
            if (prefix <= uVar18 && uVar18 != pmVar20->second) {
              __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x5dc,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                           );
            }
            if (pmVar20 !=
                msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              lVar3 = *(long *)local_238;
              uVar19 = *(ulong *)(lVar3 + (pmVar20->second - prefix) * 8);
              pmVar6 = pmVar20;
              while (pmVar20 = pmVar6, uVar19 == uVar31) {
                pmVar20 = pmVar6 + 1;
                uVar19 = pmVar6->second;
                if ((uVar19 < prefix) || (prefix + this->local_size <= uVar19)) {
                  __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                                ,0x5e1,
                                "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                               );
                }
                op.m_user_func.super__Function_base._M_functor._8_8_ =
                     (this->local_SA).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19 - prefix];
                op._vptr_custom_op = *(_func_int ***)(lVar3 + (uVar19 - prefix) * 8);
                op.m_user_func.super__Function_base._M_functor._M_unused._0_8_ =
                     (undefined8)pmVar6->first;
                if (bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    bucket.
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>::
                  _M_realloc_insert<TwoBSA<unsigned_long>const&>
                            ((vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>> *)
                             &bucket,(iterator)
                                     bucket.
                                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                             (TwoBSA<unsigned_long> *)&op);
                }
                else {
                  (bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->SA =
                       op.m_user_func.super__Function_base._M_functor._8_8_;
                  (bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->B1 =
                       (unsigned_long)op._vptr_custom_op;
                  (bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->B2 =
                       (unsigned_long)op.m_user_func.super__Function_base._M_functor._M_unused._0_8_
                  ;
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       bucket.
                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                if (pmVar20 ==
                    msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                lVar3 = *(long *)local_238;
                uVar19 = *(ulong *)(lVar3 + (pmVar6[1].second - prefix) * 8);
                pmVar6 = pmVar20;
              }
            }
            pTVar13 = right_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar12 = right_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pTVar11 = right_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pTVar10 = left_bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar9 = left_bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar8 = left_bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar7 = bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pTVar29 = bucket.
                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pmVar20 ==
                 msgs.
                 super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && ((local_22c & 1) != 0)) {
              if ((this->p + -1 <= (this->comm).m_rank) ||
                 ((*(pointer *)(local_238 + 8))[-1] != uVar16)) {
                __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x5eb,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                             );
              }
              if (uVar18 < prefix) {
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                left_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar8;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar9;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
                overlap_type = 4;
              }
              else {
                overlap_type = overlap_type + 2;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                right_bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start = pTVar11;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = pTVar12;
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar13;
                local_130 = uVar18 - prefix;
              }
            }
            else if (uVar18 < prefix) {
              overlap_type = overlap_type + 1;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              left_bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start = pTVar8;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pTVar9;
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
            }
            else {
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar19 = ((long)bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bucket.
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                lVar3 = 0x3f;
                if (uVar19 != 0) {
                  for (; uVar19 >> lVar3 == 0; lVar3 = lVar3 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (bucket.
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           bucket.
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (pTVar29,pTVar7);
              }
              sVar26 = uVar18 - prefix;
              if ((sVar26 != 0) && (uVar31 <= *(ulong *)(*(long *)local_238 + -8 + sVar26 * 8))) {
                __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x603,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                             );
              }
              if (bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                puVar21 = (this->local_SA).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar3 = *(long *)local_238;
                lVar28 = 0;
                sVar14 = uVar31 - prefix;
                pTVar29 = bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  sVar26 = sVar14;
                  if ((lVar28 != 0) &&
                     (*(long *)((long)bucket.
                                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar28 + -0x10) !=
                      *(long *)((long)&(bucket.
                                        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->B2 + lVar28))) {
                    uVar31 = prefix + sVar26;
                  }
                  puVar21[sVar26 - 1] = pTVar29->SA;
                  *(ulong *)(lVar3 + -8 + sVar26 * 8) = uVar31;
                  pTVar29 = pTVar29 + 1;
                  lVar28 = lVar28 + 0x18;
                  sVar14 = sVar26 + 1;
                } while (pTVar29 !=
                         bucket.
                         super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              uVar16 = local_b8;
              if ((sVar26 != this->local_size) &&
                 (*(long *)(*(long *)local_238 + sVar26 * 8) != prefix + sVar26 + 1)) {
                __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x620,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                             );
              }
            }
            if (bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   bucket.
                   super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            }
            poVar32 = local_238;
          } while (pmVar20 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        my_schedule = -1;
        if ((this->comm).m_rank == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&op,(long)this->p,
                     (allocator_type *)&result);
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,op._vptr_custom_op,1,&ompi_mpi_int,0,
                     (this->comm).mpi_comm);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&result,(long)this->p,
                     (allocator_type *)&border_bucket);
          if (0 < this->p) {
            lVar28 = 0;
            lVar3 = CONCAT44(result._4_4_,(uint)result);
            iVar23 = 0;
            do {
              switch(*(undefined4 *)((long)op._vptr_custom_op + lVar28 * 4)) {
              case 0:
                *(undefined4 *)(lVar3 + lVar28 * 4) = 0xffffffff;
                break;
              case 1:
              case 4:
                *(int *)(lVar3 + lVar28 * 4) = iVar23;
                break;
              case 2:
                *(undefined4 *)(lVar3 + lVar28 * 4) = 0;
                iVar23 = 0;
                break;
              case 3:
                *(int *)(lVar3 + lVar28 * 4) = iVar23;
                iVar23 = 1 - iVar23;
                break;
              default:
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                              ,0x64d,
                              "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                             );
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 < this->p);
          }
          MPI_Scatter(CONCAT44(result._4_4_,(uint)result),1,&ompi_mpi_int,&my_schedule,1,
                      &ompi_mpi_int,0,(this->comm).mpi_comm);
          if ((void *)CONCAT44(result._4_4_,(uint)result) != (void *)0x0) {
            operator_delete((void *)CONCAT44(result._4_4_,(uint)result));
          }
          if (op._vptr_custom_op != (_func_int **)0x0) {
            operator_delete(op._vptr_custom_op);
          }
        }
        else {
          MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
          MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        }
        uVar18 = lVar4 - 1;
        iVar23 = 0;
        do {
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                    (&border_bucket,&left_bucket);
          puVar1 = &(this->part).div1mod;
          if (uVar18 < *puVar1) {
            left_p = (int)(uVar18 / ((this->part).div + 1));
          }
          else {
            left_p = (int)((uVar18 - *puVar1) / (this->part).div) + (int)(this->part).mod;
          }
          bucket_offset = 0;
          rebucket_offset = uVar18;
          if (iVar23 == my_schedule || overlap_type != 3) {
            if (overlap_type == 2 && iVar23 == my_schedule) goto LAB_00129d3f;
            bVar15 = overlap_type != 0 && iVar23 == my_schedule;
          }
          else {
LAB_00129d3f:
            std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                      (&border_bucket,&right_bucket);
            left_p = (this->comm).m_rank;
            bucket_offset = local_130;
            bVar15 = true;
            rebucket_offset = prefix + local_130;
          }
          op._vptr_custom_op = (_func_int **)&left_p;
          op.m_user_func.super__Function_base._M_functor._M_unused._M_object = &border_bucket;
          op.m_user_func.super__Function_base._M_manager = (_Manager_type)&rebucket_offset;
          op.m_user_func._M_invoker = (_Invoker_type)&minqueries;
          op._40_8_ = &bucket_offset;
          op.m_user_func.super__Function_base._M_functor._8_8_ = this;
          op.m_type_copy = poVar32;
          op.m_op = (MPI_Op)&prefix;
          result._0_4_ = (uint)bVar15;
          MPI_Allreduce(&result,&result_2,1,&ompi_mpi_int,&ompi_mpi_op_land,(this->comm).mpi_comm);
          if (result_2 == 0) {
            mxx::comm::split((comm *)&result,comm,(uint)bVar15);
            if (bVar15 != false) {
              construct_msgs::anon_class_64_8_0d7252e9::operator()
                        ((anon_class_64_8_0d7252e9 *)&op,(comm *)&result);
            }
            mxx::comm::~comm((comm *)&result);
          }
          else {
            construct_msgs::anon_class_64_8_0d7252e9::operator()
                      ((anon_class_64_8_0d7252e9 *)&op,comm);
          }
          MPI_Barrier((this->comm).mpi_comm);
          if (border_bucket.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(border_bucket.
                            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 == 1);
        uVar16 = mxx::left_shift<unsigned_long>(*(unsigned_long **)poVar32,comm);
        if ((this->comm).m_rank < this->p + -1) {
          local_22c = (uint)CONCAT71((int7)((ulong)*(pointer *)(poVar32 + 8) >> 8),
                                     (*(pointer *)(poVar32 + 8))[-1] == uVar16);
        }
        else {
          local_22c = 0;
        }
        pmVar20 = msgs.
                  super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        for (; pmVar20 !=
               msgs.
               super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish; pmVar20 = pmVar20 + 1) {
          op._vptr_custom_op = (_func_int **)(pmVar20->second - prefix);
          uVar22 = pmVar20->second + 1;
          if (((*(unsigned_long *)(*(long *)poVar32 + (long)op._vptr_custom_op * 8) != uVar22) ||
              ((pp_Var27 = (_func_int **)(this->local_size - 1), op._vptr_custom_op < pp_Var27 &&
               (*(unsigned_long *)(*(long *)poVar32 + 8 + (long)op._vptr_custom_op * 8) == uVar22)))
              ) || ((op._vptr_custom_op == pp_Var27 &&
                    ((uVar16 == uVar22 && ((this->comm).m_rank < this->p + -1)))))) {
            if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&active_elements,
                         (iterator)
                         active_elements.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(unsigned_long *)&op);
            }
            else {
              *active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)op._vptr_custom_op;
              active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar21 = (this->local_SA).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar4 = *(long *)poVar32;
          pmVar20 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pmVar20->first = puVar21[pmVar20->second - prefix];
            pmVar20->second = *(unsigned_long *)(lVar4 + (pmVar20->second - prefix) * 8);
            pmVar20 = pmVar20 + 1;
          } while (pmVar20 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        mxx::
        all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,false>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_3_>
                  (&msgs,(anon_class_8_1_8991fb9c)this,comm);
        if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          puVar21 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar20 = msgs.
                    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            puVar21[pmVar20->first - prefix] = pmVar20->second;
            pmVar20 = pmVar20 + 1;
          } while (pmVar20 !=
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        op._vptr_custom_op =
             (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"bucket-chaising iteration","");
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  (&timer,(string *)&op);
        if (op._vptr_custom_op !=
            (_func_int **)((long)&op.m_user_func.super__Function_base._M_functor + 8)) {
          operator_delete(op._vptr_custom_op);
        }
        if (minqueries.
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(minqueries.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (right_bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(right_bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (left_bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(left_bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(bucket.
                          super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(out_of_bounds_msgs.
                        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msgs.
                        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((lVar5 != 0) && (uVar24 = uVar24 * 2, uVar24 < this->n));
  }
  if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(active_elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
       mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + -1;
  timer._vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001509b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)timer.sep._M_dataplus._M_p != &timer.sep.field_2) {
    operator_delete(timer.sep._M_dataplus._M_p);
  }
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}